

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

string * __thiscall
punky::ast::BlockStmt::to_string_abi_cxx11_(string *__return_storage_ptr__,BlockStmt *this)

{
  pointer puVar1;
  long *plVar2;
  long *plVar3;
  pointer puVar4;
  long *local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{ ","");
  puVar4 = (this->m_blk_statements).
           super__Vector_base<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_blk_statements).
           super__Vector_base<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      (*(((puVar4->_M_t).
          super___uniq_ptr_impl<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>.
          _M_t.
          super__Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>
          .super__Head_base<0UL,_punky::ast::StmtNode_*,_false>._M_head_impl)->super_AstNode).
        _vptr_AstNode[3])(local_50);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_60 = *plVar3;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar3;
        local_70 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BlockStmt::to_string() const
{
    std::string blk_str{"{ "};
    for (const auto& stmt : m_blk_statements)
        blk_str.append(stmt->to_string() + "\n");
    blk_str.pop_back();
    blk_str.append(" }");
    return blk_str;
}